

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void __thiscall fmt::v11::basic_specs::set_fill<char>(basic_specs *this,basic_string_view<char> s)

{
  char *pcVar1;
  basic_specs *in_RDI;
  size_t i;
  uint uchar;
  size_t size;
  size_t local_30;
  bool local_25 [5];
  ulong local_20;
  basic_string_view<char> local_10;
  
  local_20 = basic_string_view<char>::size(&local_10);
  set_fill_size(in_RDI,local_20);
  if (local_20 == 1) {
    pcVar1 = basic_string_view<char>::operator[](&local_10,0);
    in_RDI->fill_data_[0] = *pcVar1;
    in_RDI->fill_data_[1] = '\0';
    in_RDI->fill_data_[2] = '\0';
  }
  else {
    local_25[0] = local_20 < 5;
    v11::detail::ignore_unused<bool,char[13]>(local_25,(char (*) [13])"invalid fill");
    for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
      pcVar1 = basic_string_view<char>::operator[](&local_10,local_30);
      in_RDI->fill_data_[local_30 & 3] = *pcVar1;
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR void set_fill(basic_string_view<Char> s) {
    auto size = s.size();
    set_fill_size(size);
    if (size == 1) {
      unsigned uchar = static_cast<detail::unsigned_char<Char>>(s[0]);
      fill_data_[0] = static_cast<char>(uchar);
      fill_data_[1] = static_cast<char>(uchar >> 8);
      fill_data_[2] = static_cast<char>(uchar >> 16);
      return;
    }
    FMT_ASSERT(size <= max_fill_size, "invalid fill");
    for (size_t i = 0; i < size; ++i)
      fill_data_[i & 3] = static_cast<char>(s[i]);
  }